

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

TextureFormat
deqp::gles31::Functional::anon_unknown_0::getRandomFormat(Random *rng,Context *context)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar2;
  RenderContext *pRVar3;
  uint *puVar4;
  uint local_b8 [2];
  deUint32 glFormats [32];
  bool supportsES32;
  Context *context_local;
  Random *rng_local;
  
  pRVar3 = gles31::Context::getRenderContext(context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  memcpy(local_b8,&DAT_02c43a30,0x80);
  if (bVar1) {
    dVar2 = de::Random::getUint32(rng);
    puVar4 = de::getArrayElement<32,unsigned_int>((uint (*) [32])local_b8,dVar2 & 0x1f);
    rng_local = (Random *)glu::mapGLInternalFormat(*puVar4);
  }
  else {
    dVar2 = de::Random::getUint32(rng);
    puVar4 = de::getArrayElement<32,unsigned_int>((uint (*) [32])local_b8,dVar2 % 0x1b);
    rng_local = (Random *)glu::mapGLInternalFormat(*puVar4);
  }
  return (TextureFormat)rng_local;
}

Assistant:

TextureFormat getRandomFormat (de::Random& rng, Context& context)
{
	const bool supportsES32 = glu::contextSupports(context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	const deUint32 glFormats[] =
	{
		GL_R8,
		GL_RG8,
		GL_RGB8,
		GL_RGB565,
		GL_RGBA4,
		GL_RGB5_A1,
		GL_RGBA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_R8I,
		GL_R8UI,
		GL_R16I,
		GL_R16UI,
		GL_R32I,
		GL_R32UI,
		GL_RG8I,
		GL_RG8UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG32I,
		GL_RG32UI,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16F,
		GL_R32F,
		GL_RG32F,
		GL_RGBA32F,
		GL_R11F_G11F_B10F
	};

	if (supportsES32)
		return glu::mapGLInternalFormat(de::getArrayElement(glFormats, rng.getUint32() % DE_LENGTH_OF_ARRAY(glFormats)));
	else
	{
		DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(glFormats) == 32);
		return glu::mapGLInternalFormat(de::getArrayElement(glFormats, rng.getUint32() % (DE_LENGTH_OF_ARRAY(glFormats) - 5)));
	}
}